

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadSequenceBuffer.cc
# Opt level: O1

void __thiscall
ReadSequenceBuffer::ReadSequenceBuffer
          (ReadSequenceBuffer *this,PairedReadsDatastore *_ds,size_t _bufsize,size_t _chunk_size)

{
  int iVar1;
  char *pcVar2;
  
  this->paired_datastore = _ds;
  this->linked_datastore = (LinkedReadsDatastore *)0x0;
  this->long_datastore = (LongReadsDatastore *)0x0;
  this->buffer = (char *)0x0;
  this->bufsize = _bufsize;
  this->chunk_size = _chunk_size;
  iVar1 = open((_ds->filename)._M_dataplus._M_p,0);
  this->fd = iVar1;
  pcVar2 = (char *)malloc(this->bufsize);
  this->buffer = pcVar2;
  this->buffer_offset = 0xffffffffffffffff;
  return;
}

Assistant:

ReadSequenceBuffer::ReadSequenceBuffer(const PairedReadsDatastore &_ds, size_t _bufsize , size_t _chunk_size):
        paired_datastore(&_ds),bufsize(_bufsize),chunk_size(_chunk_size){
    fd=open(paired_datastore->filename.c_str(),O_RDONLY);
    buffer=(char *)malloc(bufsize);
    buffer_offset=SIZE_MAX;
}